

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

bool __thiscall Assimp::XGLImporter::ReadElementUpToClosing(XGLImporter *this,char *closetag)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  element_type *peVar5;
  bool bVar6;
  allocator<char> local_1f9;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  peVar5 = (this->m_reader).
           super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  do {
    iVar1 = (*peVar5->_vptr_IIrrXMLReader[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,closetag,&local_1f9);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x6c74f9);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_1e8 = *plVar3;
        lStack_1e0 = plVar2[3];
        local_1f8 = &local_1e8;
      }
      else {
        local_1e8 = *plVar3;
        local_1f8 = (long *)*plVar2;
      }
      local_1f0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_1d8.field_2._M_allocated_capacity = *psVar4;
        local_1d8.field_2._8_8_ = plVar2[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar4;
        local_1d8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_1d8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198,
                 &local_1d8);
      LogFunctions<Assimp::XGLImporter>::LogError((format *)local_198);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      return false;
    }
    iVar1 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[3])();
    bVar6 = iVar1 == 1;
    if (bVar6) {
      return bVar6;
    }
    iVar1 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[3])();
    if (iVar1 == 2) {
      iVar1 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[0xd])();
      if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      if (closetag == (char *)0x0) {
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar1 = strcasecmp((char *)CONCAT44(extraout_var,iVar1),closetag);
      if (iVar1 == 0) {
        return bVar6;
      }
    }
    peVar5 = (this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  } while( true );
}

Assistant:

bool XGLImporter::ReadElementUpToClosing(const char* closetag)
{
    while(m_reader->read()) {
        if (m_reader->getNodeType() == EXN_ELEMENT) {
            return true;
        }
        else if (m_reader->getNodeType() == EXN_ELEMENT_END && !ASSIMP_stricmp(m_reader->getNodeName(),closetag)) {
            return false;
        }
    }
    LogError("unexpected EOF, expected closing <" + std::string(closetag) + "> tag");
    return false;
}